

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFileControl(sqlite3_file *id,int op,void *pArg)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  int *piVar8;
  uint *puVar9;
  long lVar10;
  sqlite3_io_methods *psVar11;
  long lVar12;
  long iOff;
  long lVar13;
  bool bVar14;
  stat buf;
  undefined8 local_c8;
  _func_int_sqlite3_file_ptr *p_Stack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_98;
  int local_90;
  
  iVar3 = 0xc;
  switch(op) {
  case 1:
    uVar6 = (uint)*(byte *)((long)&id[3].pMethods + 4);
    goto LAB_0012740e;
  case 2:
  case 3:
  case 7:
  case 8:
  case 9:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x13:
    break;
  case 4:
    uVar6 = *(uint *)&id[4].pMethods;
    goto LAB_0012740e;
  case 5:
    lVar1 = *pArg;
    if (0 < *(int *)&id[9].pMethods) {
      iVar3 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,&local_c8);
      if (iVar3 == 0) {
        lVar12 = lVar1 + *(int *)&id[9].pMethods + -1;
        lVar12 = lVar12 - lVar12 % (long)*(int *)&id[9].pMethods;
        iVar3 = 0x30a;
        bVar14 = true;
        if (local_98 < lVar12) {
          lVar10 = (long)local_90;
          iOff = local_98 + lVar10 + ~(local_98 % lVar10);
          lVar13 = lVar10 + lVar12 + -1;
          if (iOff < lVar13) {
            do {
              if (lVar12 <= iOff) {
                iOff = lVar12 + -1;
              }
              iVar4 = seekAndWriteFd(*(int *)&id[3].pMethods,iOff,"",1,(int *)(id + 4));
              bVar14 = iVar4 == 1;
            } while ((bVar14) && (iOff = iOff + lVar10, iOff < lVar13));
          }
        }
      }
      else {
        iVar3 = 0x70a;
        bVar14 = false;
      }
      if (!bVar14) {
        return iVar3;
      }
    }
    iVar3 = 0;
    if ((0 < (long)id[0xc].pMethods) && ((long)id[10].pMethods < lVar1)) {
      if (*(int *)&id[9].pMethods < 1) {
        uVar6 = *(uint *)&id[3].pMethods;
        do {
          iVar3 = (*aSyscall[6].pCurrent)((ulong)uVar6,lVar1);
          if (-1 < iVar3) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        if (iVar3 != 0) {
          puVar9 = (uint *)__errno_location();
          *(uint *)&id[4].pMethods = *puVar9;
          psVar11 = id[7].pMethods;
          if (psVar11 == (sqlite3_io_methods *)0x0) {
            psVar11 = (sqlite3_io_methods *)0x1a4219;
          }
          sqlite3_log(0x60a,"os_unix.c:%d: (%d) %s(%s) - %s",0x99e7,(ulong)*puVar9,"ftruncate",
                      psVar11,"");
          return 0x60a;
        }
      }
      iVar3 = unixMapfile((unixFile *)id,lVar1);
    }
    break;
  case 6:
    *(undefined4 *)&id[9].pMethods = *pArg;
    goto LAB_0012751a;
  case 10:
    if (-1 < *pArg) {
      uVar2 = *(ushort *)((long)&id[3].pMethods + 6);
      if (*pArg == 0) {
        uVar2 = uVar2 & 0xfffb;
      }
      else {
        uVar2 = uVar2 | 4;
      }
      goto LAB_00127516;
    }
    uVar2 = *(ushort *)((long)&id[3].pMethods + 6) >> 2;
LAB_0012740b:
    uVar6 = uVar2 & 1;
LAB_0012740e:
    *(uint *)pArg = uVar6;
    goto LAB_0012751a;
  case 0xc:
    iVar3 = 0;
    pcVar7 = sqlite3_mprintf("%s",(id[1].pMethods)->xWrite);
    *(char **)pArg = pcVar7;
    break;
  case 0xd:
    if (*pArg < 0) {
      uVar2 = *(ushort *)((long)&id[3].pMethods + 6) >> 4;
      goto LAB_0012740b;
    }
    uVar2 = *(ushort *)((long)&id[3].pMethods + 6);
    if (*pArg == 0) {
      uVar2 = uVar2 & 0xffef;
    }
    else {
      uVar2 = uVar2 | 0x10;
    }
LAB_00127516:
    *(ushort *)((long)&id[3].pMethods + 6) = uVar2;
    goto LAB_0012751a;
  case 0x10:
    iVar4 = *(int *)&(id[1].pMethods)->xClose;
    iVar5 = sqlite3_initialize();
    iVar3 = 0;
    if (iVar5 == 0) {
      pcVar7 = (char *)sqlite3Malloc((long)iVar4);
    }
    else {
      pcVar7 = (char *)0x0;
    }
    if (pcVar7 != (char *)0x0) {
      unixGetTempname(*(int *)&(id[1].pMethods)->xClose,pcVar7);
      *(char **)pArg = pcVar7;
    }
    break;
  case 0x12:
    psVar11 = (sqlite3_io_methods *)sqlite3Config.mxMmap;
    if ((long)*pArg < sqlite3Config.mxMmap) {
      psVar11 = *pArg;
    }
    *(sqlite3_io_methods **)pArg = id[0xc].pMethods;
    iVar3 = 0;
    if ((((-1 < (long)psVar11) && (psVar11 != id[0xc].pMethods)) &&
        (*(int *)((long)&id[9].pMethods + 4) == 0)) &&
       (id[0xc].pMethods = psVar11, 0 < (long)id[10].pMethods)) {
      if (id[0xd].pMethods != (sqlite3_io_methods *)0x0) {
        (*aSyscall[0x17].pCurrent)(id[0xd].pMethods,id[0xb].pMethods);
        id[0xd].pMethods = (sqlite3_io_methods *)0x0;
        id[10].pMethods = (sqlite3_io_methods *)0x0;
        id[0xb].pMethods = (sqlite3_io_methods *)0x0;
      }
      iVar3 = unixMapfile((unixFile *)id,-1);
      return iVar3;
    }
    break;
  case 0x14:
    iVar3 = 0;
    uVar6 = 0;
    if (id[2].pMethods != (sqlite3_io_methods *)0x0) {
      iVar4 = (*aSyscall[4].pCurrent)(id[7].pMethods,&local_c8);
      uVar6 = 1;
      if (iVar4 == 0) {
        uVar6 = (uint)(p_Stack_c0 != (id[2].pMethods)->xClose);
      }
    }
    *(uint *)pArg = uVar6;
    break;
  default:
    if (op != 0x28) {
      return 0xc;
    }
    *(undefined4 *)pArg = 0;
    if (id[8].pMethods != (sqlite3_io_methods *)0x0) {
      lVar1 = *(long *)id[8].pMethods;
      uStack_b0 = 0;
      local_c8 = 1;
      p_Stack_c0 = (_func_int_sqlite3_file_ptr *)0x7b;
      local_b8 = 5;
      if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 8));
      }
      iVar4 = 0;
      iVar3 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(lVar1 + 0x18),5,&local_c8);
      if (iVar3 < 0) {
        iVar4 = 0xf0a;
      }
      else {
        *(uint *)pArg = (uint)((short)local_c8 != 2);
      }
      if (*(sqlite3_mutex **)(lVar1 + 8) == (sqlite3_mutex *)0x0) {
        return iVar4;
      }
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 8));
      return iVar4;
    }
LAB_0012751a:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int unixFileControl(sqlite3_file *id, int op, void *pArg){
  unixFile *pFile = (unixFile*)id;
  switch( op ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    case SQLITE_FCNTL_BEGIN_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_START_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_BEGIN_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_COMMIT_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_COMMIT_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_COMMIT_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_ROLLBACK_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_ABORT_VOLATILE_WRITE);
      return rc ? SQLITE_IOERR_ROLLBACK_ATOMIC : SQLITE_OK;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    case SQLITE_FCNTL_LOCKSTATE: {
      *(int*)pArg = pFile->eFileLock;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_LAST_ERRNO: {
      *(int*)pArg = pFile->lastErrno;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_CHUNK_SIZE: {
      pFile->szChunk = *(int *)pArg;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_SIZE_HINT: {
      int rc;
      SimulateIOErrorBenign(1);
      rc = fcntlSizeHint(pFile, *(i64 *)pArg);
      SimulateIOErrorBenign(0);
      return rc;
    }
    case SQLITE_FCNTL_PERSIST_WAL: {
      unixModeBit(pFile, UNIXFILE_PERSIST_WAL, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_POWERSAFE_OVERWRITE: {
      unixModeBit(pFile, UNIXFILE_PSOW, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_VFSNAME: {
      *(char**)pArg = sqlite3_mprintf("%s", pFile->pVfs->zName);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_TEMPFILENAME: {
      char *zTFile = sqlite3_malloc64( pFile->pVfs->mxPathname );
      if( zTFile ){
        unixGetTempname(pFile->pVfs->mxPathname, zTFile);
        *(char**)pArg = zTFile;
      }
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_HAS_MOVED: {
      *(int*)pArg = fileHasMoved(pFile);
      return SQLITE_OK;
    }
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    case SQLITE_FCNTL_LOCK_TIMEOUT: {
      int iOld = pFile->iBusyTimeout;
      pFile->iBusyTimeout = *(int*)pArg;
      *(int*)pArg = iOld;
      return SQLITE_OK;
    }
#endif
#if SQLITE_MAX_MMAP_SIZE>0
    case SQLITE_FCNTL_MMAP_SIZE: {
      i64 newLimit = *(i64*)pArg;
      int rc = SQLITE_OK;
      if( newLimit>sqlite3GlobalConfig.mxMmap ){
        newLimit = sqlite3GlobalConfig.mxMmap;
      }

      /* The value of newLimit may be eventually cast to (size_t) and passed
      ** to mmap(). Restrict its value to 2GB if (size_t) is not at least a
      ** 64-bit type. */
      if( newLimit>0 && sizeof(size_t)<8 ){
        newLimit = (newLimit & 0x7FFFFFFF);
      }

      *(i64*)pArg = pFile->mmapSizeMax;
      if( newLimit>=0 && newLimit!=pFile->mmapSizeMax && pFile->nFetchOut==0 ){
        pFile->mmapSizeMax = newLimit;
        if( pFile->mmapSize>0 ){
          unixUnmapfile(pFile);
          rc = unixMapfile(pFile, -1);
        }
      }
      return rc;
    }
#endif
#ifdef SQLITE_DEBUG
    /* The pager calls this method to signal that it has done
    ** a rollback and that the database is therefore unchanged and
    ** it hence it is OK for the transaction change counter to be
    ** unchanged.
    */
    case SQLITE_FCNTL_DB_UNCHANGED: {
      ((unixFile*)id)->dbUpdate = 0;
      return SQLITE_OK;
    }
#endif
#if SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__)
    case SQLITE_FCNTL_SET_LOCKPROXYFILE:
    case SQLITE_FCNTL_GET_LOCKPROXYFILE: {
      return proxyFileControl(id,op,pArg);
    }
#endif /* SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__) */

    case SQLITE_FCNTL_EXTERNAL_READER: {
#ifndef SQLITE_OMIT_WAL
      return unixFcntlExternalReader((unixFile*)id, (int*)pArg);
#else
      *(int*)pArg = 0;
      return SQLITE_OK;
#endif
    }
  }
  return SQLITE_NOTFOUND;
}